

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,
          KNearestNeighborsClassifier *modelParameters,bool allowEmptyLabels,
          bool defaultClassLabelIsInt64)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  int iVar3;
  int32 modelVersion;
  Int64Vector *pIVar4;
  StringVector *pSVar5;
  ModelDescription *interface_00;
  undefined1 local_130 [8];
  Result result;
  ModelDescription *interface;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  byte local_23;
  byte local_22;
  byte local_21;
  bool expected_class_is_int64;
  bool defaultClassLabelIsInt64_local;
  KNearestNeighborsClassifier *pKStack_20;
  bool allowEmptyLabels_local;
  KNearestNeighborsClassifier *modelParameters_local;
  Model *model_local;
  
  local_21 = (byte)modelParameters & 1;
  local_22 = allowEmptyLabels;
  pKStack_20 = (KNearestNeighborsClassifier *)model;
  modelParameters_local = (KNearestNeighborsClassifier *)this;
  model_local = (Model *)__return_storage_ptr__;
  CVar2 = Specification::KNearestNeighborsClassifier::ClassLabels_case
                    ((KNearestNeighborsClassifier *)model);
  if (CVar2 == CLASSLABELS_NOT_SET) {
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"Classifier models must provide class labels.",
                 (allocator *)((long)&interface + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&interface + 7));
      return __return_storage_ptr__;
    }
    local_23 = local_22 & 1;
  }
  else if (CVar2 == kStringClassLabels) {
    if ((local_21 & 1) == 0) {
      pSVar5 = Specification::KNearestNeighborsClassifier::stringclasslabels(pKStack_20);
      iVar3 = Specification::StringVector::vector_size(pSVar5);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,
                   "Classifier declared to have String class labels must provide labels.",&local_a9)
        ;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        return __return_storage_ptr__;
      }
    }
    pIVar4 = Specification::KNearestNeighborsClassifier::int64classlabels(pKStack_20);
    iVar3 = Specification::Int64Vector::vector_size(pIVar4);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,&local_d1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      return __return_storage_ptr__;
    }
    local_23 = 0;
  }
  else if (CVar2 == kInt64ClassLabels) {
    if ((local_21 & 1) == 0) {
      pIVar4 = Specification::KNearestNeighborsClassifier::int64classlabels(pKStack_20);
      iVar3 = Specification::Int64Vector::vector_size(pIVar4);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_48,
                   "Classifier declared to have Int64 class labels must provide labels.",&local_49);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return __return_storage_ptr__;
      }
    }
    pSVar5 = Specification::KNearestNeighborsClassifier::stringclasslabels(pKStack_20);
    iVar3 = Specification::StringVector::vector_size(pSVar5);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,
                 "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                 ,&local_81);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      return __return_storage_ptr__;
    }
    local_23 = 1;
  }
  interface_00 = Specification::Model::description((Model *)modelParameters_local);
  result.m_message.field_2._8_8_ = interface_00;
  modelVersion = Specification::Model::specificationversion((Model *)modelParameters_local);
  validateFeatureDescriptions((Result *)local_130,interface_00,modelVersion);
  bVar1 = Result::good((Result *)local_130);
  if (bVar1) {
    validateClassifierFeatureDescriptions
              (__return_storage_ptr__,(ModelDescription *)result.m_message.field_2._8_8_,
               (bool)(local_23 & 1));
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_130);
  }
  Result::~Result((Result *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false) {
        
        bool expected_class_is_int64;
        
        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }
                
                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }
                
                expected_class_is_int64 = true;
                
                break;
                
            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }
                
                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }
                
                expected_class_is_int64 = false;
                
                break;
                
            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();
        
            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion());
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }